

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerSettings.cpp
# Opt level: O2

char * __thiscall HD44780AnalyzerSettings::SaveSettings(HD44780AnalyzerSettings *this)

{
  char *pcVar1;
  long lVar2;
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::operator<<(&text_archive,"SaleaeHD44780Analyzer");
  SimpleArchive::operator<<(&text_archive,1);
  SimpleArchive::operator<<(&text_archive,&this->mEChannel);
  SimpleArchive::operator<<(&text_archive,&this->mRSChannel);
  SimpleArchive::operator<<(&text_archive,&this->mRWChannel);
  for (lVar2 = 0x40; lVar2 != 0xc0; lVar2 = lVar2 + 0x10) {
    SimpleArchive::operator<<(&text_archive,(Channel *)(&this->super_AnalyzerSettings + lVar2));
  }
  SimpleArchive::operator<<(&text_archive,this->mMarkTimingErrors);
  SimpleArchive::operator<<(&text_archive,this->mEnableCycleMin);
  SimpleArchive::operator<<(&text_archive,this->mEnablePulseWidthMin);
  SimpleArchive::operator<<(&text_archive,this->mAddressSetupMin);
  SimpleArchive::operator<<(&text_archive,this->mAddressHoldMin);
  SimpleArchive::operator<<(&text_archive,this->mDataWriteSetupMin);
  SimpleArchive::operator<<(&text_archive,this->mDataWriteHoldMin);
  SimpleArchive::operator<<(&text_archive,this->mDataReadDelayMax);
  SimpleArchive::operator<<(&text_archive,this->mDataReadHoldMin);
  SimpleArchive::operator<<(&text_archive,this->mIgnoreEPulsesWhenBusy);
  SimpleArchive::operator<<(&text_archive,this->mBusyTimeClearHome);
  SimpleArchive::operator<<(&text_archive,this->mBusyTimeCmdChar);
  SimpleArchive::operator<<(&text_archive,this->mStartIn4BitMode);
  SimpleArchive::operator<<(&text_archive,this->mDoNotGenerateBusyCheckFrames);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return pcVar1;
}

Assistant:

const char* HD44780AnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;
    U32 dbline;

    // save settings
    text_archive << ANALYZER_SAVE_NAME;
    text_archive << ANALYZER_SAVE_VERSION;
    text_archive << mEChannel;
    text_archive << mRSChannel;
    text_archive << mRWChannel;
    for( dbline = 0; dbline < 8; dbline++ )
        text_archive << mDBChannel[ dbline ];
    text_archive << mMarkTimingErrors;
    text_archive << mEnableCycleMin;
    text_archive << mEnablePulseWidthMin;
    text_archive << mAddressSetupMin;
    text_archive << mAddressHoldMin;
    text_archive << mDataWriteSetupMin;
    text_archive << mDataWriteHoldMin;
    text_archive << mDataReadDelayMax;
    text_archive << mDataReadHoldMin;
    text_archive << mIgnoreEPulsesWhenBusy;
    text_archive << mBusyTimeClearHome;
    text_archive << mBusyTimeCmdChar;
    text_archive << mStartIn4BitMode;
    text_archive << mDoNotGenerateBusyCheckFrames;

    return SetReturnString( text_archive.GetString() );
}